

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall Args::BaseException::~BaseException(BaseException *this)

{
  *(undefined ***)this = &PTR__BaseException_00115ba0;
  std::__cxx11::string::~string((string *)&this->m_what);
  std::logic_error::~logic_error(&this->super_logic_error);
  return;
}

Assistant:

virtual ~BaseException() noexcept
	{
	}